

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O3

bool __thiscall Json::Reader::decodeNumber(Reader *this,Token *token)

{
  byte bVar1;
  byte bVar2;
  byte *pbVar3;
  byte *pbVar4;
  bool bVar5;
  long lVar6;
  bool bVar7;
  long lVar8;
  long *plVar9;
  _Elt_pointer ppVVar10;
  long *plVar11;
  size_type *psVar12;
  ulong uVar13;
  uint uVar14;
  ulong value;
  byte *pbVar15;
  ValueHolder local_88;
  long local_80;
  size_type local_78;
  long lStack_70;
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  long *local_48 [2];
  long local_38 [2];
  
  pbVar3 = (byte *)token->start_;
  pbVar4 = (byte *)token->end_;
  if (pbVar3 != pbVar4) {
    lVar8 = 0;
    bVar7 = false;
    do {
      bVar5 = !bVar7;
      bVar7 = true;
      if (bVar5) {
        uVar14 = pbVar3[lVar8] - 0x2b;
        if (uVar14 < 0x3b) {
          if ((0x400000004000009U >> ((ulong)uVar14 & 0x3f) & 1) == 0) {
            if ((ulong)uVar14 != 2) goto LAB_001437ef;
            bVar7 = lVar8 != 0;
          }
        }
        else {
LAB_001437ef:
          bVar7 = false;
        }
      }
      lVar6 = lVar8 + 1;
      lVar8 = lVar8 + 1;
    } while (pbVar3 + lVar6 != pbVar4);
    if (bVar7) {
LAB_001437f8:
      bVar7 = decodeDouble(this,token);
      return bVar7;
    }
  }
  bVar1 = *pbVar3;
  value = 0;
  if (bVar1 == 0x2d) {
    uVar13 = 0x8000000000000000;
  }
  else {
    uVar13 = 0xffffffffffffffff;
  }
  pbVar15 = pbVar3 + (bVar1 == 0x2d);
  if (pbVar15 < pbVar4) {
    value = 0;
    do {
      bVar2 = *pbVar15;
      if ((byte)(bVar2 - 0x3a) < 0xf6) {
        local_48[0] = local_38;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_48,pbVar3,pbVar4);
        plVar9 = (long *)std::__cxx11::string::replace((ulong)local_48,0,(char *)0x0,0x17a8a1);
        plVar11 = plVar9 + 2;
        if ((long *)*plVar9 == plVar11) {
          local_58 = *plVar11;
          lStack_50 = plVar9[3];
          local_68 = &local_58;
        }
        else {
          local_58 = *plVar11;
          local_68 = (long *)*plVar9;
        }
        local_60 = plVar9[1];
        *plVar9 = (long)plVar11;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_68);
        psVar12 = (size_type *)(plVar9 + 2);
        if ((size_type *)*plVar9 == psVar12) {
          local_78 = *psVar12;
          lStack_70 = plVar9[3];
          local_88.string_ = (char *)&local_78;
        }
        else {
          local_78 = *psVar12;
          local_88.string_ = ((char *)*plVar9).string_;
        }
        local_80 = plVar9[1];
        *plVar9 = (long)psVar12;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        addError(this,(string *)&local_88,token,(Location)0x0);
        if (local_88 != &local_78) {
          operator_delete(local_88.string_,local_78 + 1);
        }
        if (local_68 != &local_58) {
          operator_delete(local_68,local_58 + 1);
        }
        if (local_48[0] != local_38) {
          operator_delete(local_48[0],local_38[0] + 1);
        }
        return false;
      }
      pbVar15 = pbVar15 + 1;
      uVar14 = bVar2 - 0x30;
      if ((uVar13 / 10 <= value) &&
         (((uVar13 / 10 < value || (pbVar15 != pbVar4)) || (uVar13 % 10 < (ulong)uVar14))))
      goto LAB_001437f8;
      value = (ulong)uVar14 + value * 10;
    } while (pbVar15 < pbVar4);
  }
  if (bVar1 == 0x2d) {
    Value::Value((Value *)&local_88,-value);
    ppVVar10 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar10 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar10 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    Value::operator=(ppVVar10[-1],(Value *)&local_88);
  }
  else if (value < 0x80000000) {
    Value::Value((Value *)&local_88,value);
    ppVVar10 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar10 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar10 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    Value::operator=(ppVVar10[-1],(Value *)&local_88);
  }
  else {
    Value::Value((Value *)&local_88,value);
    ppVVar10 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar10 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar10 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    Value::operator=(ppVVar10[-1],(Value *)&local_88);
  }
  Value::~Value((Value *)&local_88);
  return true;
}

Assistant:

bool 
Reader::decodeNumber( Token &token )
{
   bool isDouble = false;
   for ( Location inspect = token.start_; inspect != token.end_; ++inspect )
   {
      isDouble = isDouble  
                 ||  in( *inspect, '.', 'e', 'E', '+' )  
                 ||  ( *inspect == '-'  &&  inspect != token.start_ );
   }
   if ( isDouble )
      return decodeDouble( token );
   // Attempts to parse the number as an integer. If the number is
   // larger than the maximum supported value of an integer then
   // we decode the number as a double.
   Location current = token.start_;
   bool isNegative = *current == '-';
   if ( isNegative )
      ++current;
   Value::LargestUInt maxIntegerValue = isNegative ? Value::LargestUInt(-Value::minLargestInt) 
                                                   : Value::maxLargestUInt;
   Value::LargestUInt threshold = maxIntegerValue / 10;
   Value::LargestUInt value = 0;
   while ( current < token.end_ )
   {
      Char c = *current++;
      if ( c < '0'  ||  c > '9' )
         return addError( "'" + std::string( token.start_, token.end_ ) + "' is not a number.", token );
      Value::UInt digit(c - '0');
      if ( value >= threshold )
      {
         // We've hit or exceeded the max value divided by 10 (rounded down). If
         // a) we've only just touched the limit, b) this is the last digit, and
         // c) it's small enough to fit in that rounding delta, we're okay.
         // Otherwise treat this number as a double to avoid overflow.
         if (value > threshold ||
             current != token.end_ ||
             digit > maxIntegerValue % 10)
         {
            return decodeDouble( token );
         }
      }
      value = value * 10 + digit;
   }
   if ( isNegative )
      currentValue() = -Value::LargestInt( value );
   else if ( value <= Value::LargestUInt(Value::maxInt) )
      currentValue() = Value::LargestInt( value );
   else
      currentValue() = value;
   return true;
}